

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# submit-6MixQuery.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> *
QueryPolygonFromMixQuery
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,int n,
          vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *polygon)

{
  undefined8 *puVar1;
  pointer ppVar2;
  undefined8 uVar3;
  int iVar4;
  long lVar5;
  pair<double,_double> *ppVar6;
  int *__args;
  GridSet_conflict grid_set;
  double local_a8;
  double dStack_a0;
  anon_struct_104_14_c41118a6 local_98;
  
  if (ans.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
      ans.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start) {
    ans.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         ans.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  }
  if (0 < n) {
    ppVar2 = (polygon->
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      puVar1 = (undefined8 *)((long)&ppVar2->first + lVar5);
      uVar3 = puVar1[1];
      *(undefined8 *)((long)pgon[0] + lVar5) = *puVar1;
      *(undefined8 *)((long)pgon[0] + lVar5 + 8) = uVar3;
      lVar5 = lVar5 + 0x10;
    } while ((ulong)(uint)n << 4 != lVar5);
  }
  GridSetup(pgon,n,100,&local_98);
  if (0 < Point_cnt) {
    __args = Point_id;
    ppVar6 = Point;
    lVar5 = 0;
    do {
      local_a8 = ppVar6->first;
      dStack_a0 = ppVar6->second;
      iVar4 = GridTest(&local_98,&local_a8);
      if ((iVar4 != 0) && (is_erase_Point[*__args % 0xf4247] == false)) {
        if (ans.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            ans.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&ans,
                     (iterator)
                     ans.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,__args);
        }
        else {
          *ans.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = *__args;
          ans.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = ans.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
      }
      lVar5 = lVar5 + 1;
      __args = __args + 1;
      ppVar6 = ppVar6 + 1;
    } while (lVar5 < Point_cnt);
  }
  GridCleanup(&local_98);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,&ans);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> QueryPolygonFromMixQuery(int n, std::vector<std::pair<double, double>> &polygon) {
    ans.clear();
    GridSet grid_set;
    for (int i = 0; i < n; i++)
        pgon[i][0] = polygon[i].first,
        pgon[i][1] = polygon[i].second;
    GridSetup(pgon, n, Grid_Resolution, &grid_set);
    for (int i = 0; i<Point_cnt; i++) {
        double point[2];
        point[0] = Point[i].first, point[1] = Point[i].second;
        if (GridTest(&grid_set, point))
            if (!is_erase_Point[Point_id[i]%mod])
                ans.push_back(Point_id[i]);
    }
    GridCleanup(&grid_set);
    return ans;
}